

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

string * __thiscall
zmq::detail::socket_base::get<5,0>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,socket_base *this,size_type param_3)

{
  mutable_buffer mVar1;
  void *local_60;
  size_t local_58;
  size_t size;
  allocator<char> local_2a;
  undefined1 local_29;
  size_type local_28;
  size_t init_size_local;
  socket_base *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  string *str;
  
  local_29 = 0;
  local_28 = param_3;
  init_size_local = (size_t)this;
  local_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,param_3,'\0',&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  mVar1 = buffer<char,std::char_traits<char>,std::allocator<char>>(__return_storage_ptr__);
  local_60 = mVar1._data;
  local_58 = mVar1._size;
  get<5,1>(this,local_60,local_58);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ZMQ_NODISCARD std::string get(sockopt::array_option<Opt, NullTerm>,
                                  size_t init_size = 1024) const
    {
        if ZMQ_CONSTEXPR_IF (NullTerm == 2) {
            if (init_size == 1024) {
                init_size = 41; // get as Z85 string
            }
        }
        std::string str(init_size, '\0');
        size_t size = get(sockopt::array_option<Opt>{}, buffer(str));
        if ZMQ_CONSTEXPR_IF (NullTerm == 1) {
            if (size > 0) {
                assert(str[size - 1] == '\0');
                --size;
            }
        } else if ZMQ_CONSTEXPR_IF (NullTerm == 2) {
            assert(size == 32 || size == 41);
            if (size == 41) {
                assert(str[size - 1] == '\0');
                --size;
            }
        }
        str.resize(size);
        return str;
    }